

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result)

{
  int iVar1;
  Message *pMVar2;
  long lVar3;
  long lVar4;
  Symbol symbol;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *pRVar5;
  Descriptor *pDVar6;
  string *psVar7;
  string *psVar8;
  void *pvVar9;
  LogMessage *pLVar10;
  size_t sVar11;
  OptionsType *orig_options;
  DescriptorProto *arg9;
  long lVar12;
  long lVar13;
  long *plVar14;
  long lVar15;
  DescriptorProto *pDVar16;
  long local_2d0;
  long local_2c0;
  string local_2b0;
  undefined1 local_290 [48];
  SubstituteArg local_260;
  undefined4 local_230;
  undefined4 uStack_22c;
  Descriptor *pDStack_228;
  SubstituteArg local_220;
  LogMessage local_1f0;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  SubstituteArg local_f8;
  SubstituteArg local_c8;
  SubstituteArg local_98;
  LogMessage local_68;
  
  pDVar6 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar6 = (Descriptor *)this->file_;
  }
  psVar7 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar6 + 8));
  if (psVar7->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)psVar7,psVar7->_M_string_length,0,'\x01');
  }
  arg9 = proto;
  std::__cxx11::string::_M_append((char *)psVar7,(ulong)(proto->name_->_M_dataplus)._M_p);
  ValidateSymbolName(this,proto->name_,psVar7,&proto->super_Message);
  psVar8 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar8;
  *(string **)(result + 8) = psVar7;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  iVar1 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x2c) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 0x78);
  *(void **)(result + 0x30) = pvVar9;
  if (0 < (proto->field_).super_RepeatedPtrFieldBase.current_size_) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      BuildFieldOrExtension
                (this,(FieldDescriptorProto *)
                      (proto->field_).super_RepeatedPtrFieldBase.elements_[lVar15],result,
                 (FieldDescriptor *)(*(long *)(result + 0x30) + lVar13),false);
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x78;
    } while (lVar15 < (proto->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x38) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 0x78);
  *(void **)(result + 0x40) = pvVar9;
  if (0 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      BuildMessage(this,(DescriptorProto *)
                        (proto->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar15],result,
                   (Descriptor *)(*(long *)(result + 0x40) + lVar13));
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x78;
    } while (lVar15 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x48) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 0x38);
  *(void **)(result + 0x50) = pvVar9;
  if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      BuildEnum(this,(EnumDescriptorProto *)
                     (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar15],result,
                (EnumDescriptor *)(*(long *)(result + 0x50) + lVar13));
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x38;
    } while (lVar15 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x58) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 << 3);
  *(void **)(result + 0x60) = pvVar9;
  if (0 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      BuildExtensionRange(this,*(ExtensionRange **)
                                ((long)(proto->extension_range_).super_RepeatedPtrFieldBase.
                                       elements_ + lVar13),result,
                          (ExtensionRange *)(*(long *)(result + 0x60) + lVar13));
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar15 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x68) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 0x78);
  *(void **)(result + 0x70) = pvVar9;
  if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      BuildFieldOrExtension
                (this,(FieldDescriptorProto *)
                      (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar15],result,
                 (FieldDescriptor *)(*(long *)(result + 0x70) + lVar13),true);
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x78;
    } while (lVar15 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((proto->_has_bits_[0] & 0x40) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = *(OptionsType **)(DescriptorProto::default_instance_ + 0x90);
    }
    AllocateOptionsImpl<google::protobuf::Descriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  local_230 = 1;
  symbol._4_4_ = uStack_22c;
  symbol.type = 1;
  symbol.field_1.descriptor = result;
  pDStack_228 = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  if (0 < *(int *)(result + 0x2c)) {
    local_2d0 = 0;
    do {
      if (0 < *(int *)(result + 0x58)) {
        plVar14 = (long *)(local_2d0 * 0x78 + *(long *)(result + 0x30));
        lVar13 = 0;
        do {
          lVar15 = *(long *)(result + 0x60);
          if ((*(int *)(lVar15 + lVar13 * 8) <= (int)plVar14[5]) &&
             ((int)plVar14[5] < *(int *)(lVar15 + 4 + lVar13 * 8))) {
            psVar7 = (string *)plVar14[1];
            if ((arg9->extension_range_).super_RepeatedPtrFieldBase.current_size_ <= lVar13) {
              internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar10 = internal::LogMessage::operator<<
                                  (&local_68,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1f0,pLVar10);
              internal::LogMessage::~LogMessage(&local_68);
            }
            pMVar2 = (Message *)
                     (arg9->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar13];
            local_1f0._0_8_ =
                 FastInt32ToBuffer(*(int32 *)(lVar15 + lVar13 * 8),
                                   (char *)((long)&local_1f0.filename_ + 4));
            sVar11 = strlen((char *)local_1f0._0_8_);
            local_1f0.filename_._0_4_ = (undefined4)sVar11;
            local_260.text_ =
                 FastInt32ToBuffer(*(int *)(lVar15 + 4 + lVar13 * 8) + -1,local_260.scratch_);
            sVar11 = strlen(local_260.text_);
            local_260.size_ = (int)sVar11;
            local_188.text_ = *(char **)*plVar14;
            local_188.size_ = *(int *)((undefined8 *)*plVar14 + 1);
            local_220.text_ = FastInt32ToBuffer((int32)plVar14[5],local_220.scratch_);
            sVar11 = strlen(local_220.text_);
            local_220.size_ = (int)sVar11;
            local_1b8.text_ = (char *)0x0;
            local_1b8.size_ = -1;
            local_98.text_ = (char *)0x0;
            local_98.size_ = -1;
            local_c8.text_ = (char *)0x0;
            local_c8.size_ = -1;
            local_f8.text_ = (char *)0x0;
            local_f8.size_ = -1;
            local_128.text_ = (char *)0x0;
            local_128.size_ = -1;
            local_158.text_ = (char *)0x0;
            local_158.size_ = -1;
            strings::Substitute_abi_cxx11_
                      ((string *)local_290,
                       (strings *)"Extension range $0 to $1 includes field \"$2\" ($3).",
                       (char *)&local_1f0,&local_260,&local_188,&local_220,&local_1b8,&local_98,
                       &local_c8,&local_f8,&local_128,&local_158,(SubstituteArg *)arg9);
            AddError(this,psVar7,pMVar2,NUMBER,(string *)local_290);
            if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
              operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(result + 0x58));
      }
      local_2d0 = local_2d0 + 1;
    } while (local_2d0 < *(int *)(result + 0x2c));
  }
  if (0 < *(int *)(result + 0x58)) {
    local_2c0 = 1;
    lVar13 = 0;
    pDVar16 = arg9;
    do {
      lVar15 = lVar13 + 1;
      if (lVar15 < *(int *)(result + 0x58)) {
        lVar3 = *(long *)(result + 0x60);
        lVar12 = local_2c0;
        do {
          lVar4 = *(long *)(result + 0x60);
          if ((*(int *)(lVar4 + lVar12 * 8) < *(int *)(lVar3 + 4 + lVar13 * 8)) &&
             (*(int *)(lVar3 + lVar13 * 8) < *(int *)(lVar4 + 4 + lVar12 * 8))) {
            psVar7 = *(string **)(result + 8);
            pRVar5 = &arg9->extension_range_;
            arg9 = pDVar16;
            if ((pRVar5->super_RepeatedPtrFieldBase).current_size_ <= lVar12) {
              internal::LogMessage::LogMessage
                        (&local_1f0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar10 = internal::LogMessage::operator<<
                                  (&local_1f0,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_260,pLVar10);
              internal::LogMessage::~LogMessage(&local_1f0);
              arg9 = pDVar16;
            }
            pMVar2 = (Message *)
                     (arg9->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar12];
            local_260.text_ = FastInt32ToBuffer(*(int32 *)(lVar4 + lVar12 * 8),local_260.scratch_);
            sVar11 = strlen(local_260.text_);
            local_260.size_ = (int)sVar11;
            local_188.text_ =
                 FastInt32ToBuffer(*(int *)(lVar4 + 4 + lVar12 * 8) + -1,local_188.scratch_);
            sVar11 = strlen(local_188.text_);
            local_188.size_ = (int)sVar11;
            local_220.text_ = FastInt32ToBuffer(*(int32 *)(lVar3 + lVar13 * 8),local_220.scratch_);
            sVar11 = strlen(local_220.text_);
            local_220.size_ = (int)sVar11;
            local_1b8.text_ =
                 FastInt32ToBuffer(*(int *)(lVar3 + 4 + lVar13 * 8) + -1,local_1b8.scratch_);
            sVar11 = strlen(local_1b8.text_);
            local_1b8.size_ = (int)sVar11;
            local_98.text_ = (char *)0x0;
            local_98.size_ = -1;
            local_c8.text_ = (char *)0x0;
            local_c8.size_ = -1;
            local_f8.text_ = (char *)0x0;
            local_f8.size_ = -1;
            local_128.text_ = (char *)0x0;
            local_128.size_ = -1;
            local_158.text_ = (char *)0x0;
            local_158.size_ = -1;
            local_290._0_8_ = (pointer)0x0;
            local_290._8_4_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_2b0,
                       (strings *)
                       "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",
                       (char *)&local_260,&local_188,&local_220,&local_1b8,&local_98,&local_c8,
                       &local_f8,&local_128,&local_158,(SubstituteArg *)local_290,
                       (SubstituteArg *)arg9);
            AddError(this,psVar7,pMVar2,NUMBER,&local_2b0);
            pDVar16 = arg9;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
              pDVar16 = arg9;
            }
          }
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 < *(int *)(result + 0x58));
      }
      local_2c0 = local_2c0 + 1;
      lVar13 = lVar15;
    } while (lVar15 < *(int *)(result + 0x58));
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  BUILD_ARRAY(proto, result, field          , BuildField         , result);
  BUILD_ARRAY(proto, result, nested_type    , BuildMessage       , result);
  BUILD_ARRAY(proto, result, enum_type      , BuildEnum          , result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension      , BuildExtension     , result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));

  // Check that no fields have numbers in extension ranges.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Extension range $0 to $1 includes field \"$2\" ($3).",
                   range->start, range->end - 1,
                   field->name(), field->number()));
      }
    }
  }

  // Check that extension ranges don't overlap.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2->start, range2->end - 1,
                                     range1->start, range1->end - 1));
      }
    }
  }
}